

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

VarId pop(void)

{
  uint32_t uVar1;
  VarId *a;
  undefined8 *in_RDI;
  VarId VVar2;
  
  *in_RDI = &PTR_display_001d90d0;
  uVar1 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].id;
  *(uint32_t *)(in_RDI + 1) = uVar1;
  V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
  super__Vector_impl_data._M_finish =
       V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  VVar2.id = uVar1;
  VVar2.super_Displayable._vptr_Displayable = (_func_int **)in_RDI;
  VVar2._12_4_ = 0;
  return VVar2;
}

Assistant:

mir::inst::VarId pop() {
  mir::inst::VarId a = V.back();
  V.pop_back();
  return a;
}